

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_bool32 drwav_seek_to_first_pcm_frame(drwav *pWav)

{
  int iVar1;
  long in_RDI;
  drwav_bool32 local_8;
  
  if (*(long *)(in_RDI + 8) == 0) {
    iVar1 = (**(code **)(in_RDI + 0x10))
                      (*(undefined8 *)(in_RDI + 0x18),*(ulong *)(in_RDI + 0x88) & 0xffffffff,0);
    if (iVar1 == 0) {
      local_8 = 0;
    }
    else {
      if (*(short *)(in_RDI + 0x74) == 2 || *(short *)(in_RDI + 0x74) == 0x11) {
        *(undefined8 *)(in_RDI + 0x120) = 0;
        if (*(short *)(in_RDI + 0x74) == 2) {
          memset((void *)(in_RDI + 0x128),0,0x34);
        }
        else {
          if (*(short *)(in_RDI + 0x74) != 0x11) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                          ,0xe4e,"drwav_bool32 drwav_seek_to_first_pcm_frame(drwav *)");
          }
          memset((void *)(in_RDI + 0x15c),0,0x58);
        }
      }
      *(undefined8 *)(in_RDI + 0x90) = *(undefined8 *)(in_RDI + 0x80);
      local_8 = 1;
    }
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

DRWAV_API drwav_bool32 drwav_seek_to_first_pcm_frame(drwav* pWav)
{
    if (pWav->onWrite != NULL) {
        return DRWAV_FALSE; /* No seeking in write mode. */
    }

    if (!pWav->onSeek(pWav->pUserData, (int)pWav->dataChunkDataPos, drwav_seek_origin_start)) {
        return DRWAV_FALSE;
    }

    if (drwav__is_compressed_format_tag(pWav->translatedFormatTag)) {
        pWav->compressed.iCurrentPCMFrame = 0;

        /* Cached data needs to be cleared for compressed formats. */
        if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
            DRWAV_ZERO_OBJECT(&pWav->msadpcm);
        } else if (pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
            DRWAV_ZERO_OBJECT(&pWav->ima);
        } else {
            DRWAV_ASSERT(DRWAV_FALSE);  /* If this assertion is triggered it means I've implemented a new compressed format but forgot to add a branch for it here. */
        }
    }
    
    pWav->bytesRemaining = pWav->dataChunkDataSize;
    return DRWAV_TRUE;
}